

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O1

bool __thiscall
DIS::IncomingMessage::FindProccessorContainer
          (IncomingMessage *this,uchar id,IPacketProcessor *pp,iterator *containerIter)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  _Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_> _Var2;
  _Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_> _Var3;
  bool bVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>_>
  pVar5;
  uchar local_19;
  
  local_19 = id;
  pVar5 = std::
          _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>,_std::_Select1st<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>_>
          ::equal_range(&(this->_processors)._M_t,&local_19);
  _Var3 = pVar5.second._M_node;
  _Var2 = pVar5.first._M_node;
  bVar4 = _Var2._M_node != _Var3._M_node;
  if (bVar4) {
    p_Var1 = _Var2._M_node[1]._M_parent;
    while (p_Var1 != (_Base_ptr)pp) {
      _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
      bVar4 = _Var2._M_node != _Var3._M_node;
      if (_Var2._M_node == _Var3._M_node) {
        return bVar4;
      }
      p_Var1 = _Var2._M_node[1]._M_parent;
    }
    containerIter->_M_node = _Var2._M_node;
  }
  return bVar4;
}

Assistant:

bool IncomingMessage::FindProccessorContainer(unsigned char id, const IPacketProcessor* pp, PacketProcessorContainer::iterator &containerIter)
{  
   PacketProcessIteratorPair iterPair = _processors.equal_range(id);

   // Check to make sure that the processor we're trying to add is not already there
   while (iterPair.first != iterPair.second)
   {
      // If this processor with a matching id has a the exact same processor, bail
      if ((iterPair.first)->second == pp)
      {
         containerIter = iterPair.first;
         return true;
      }

      iterPair.first++;
   }

   // No matches were found in the loop
   return false;
}